

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_int_&,_const_int_&> * __thiscall
Catch::ExprLhs<int_const&>::operator!=
          (BinaryExpr<const_int_&,_const_int_&> *__return_storage_ptr__,ExprLhs<int_const&> *this,
          int *rhs)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  StringRef local_40;
  
  piVar3 = *(int **)this;
  iVar1 = *piVar3;
  iVar2 = *rhs;
  StringRef::StringRef(&local_40,"!=");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = iVar1 != iVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001a8c98;
  __return_storage_ptr__->m_lhs = piVar3;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }